

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *
parseV5EntryFormat(Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                   *__return_storage_ptr__,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,
                  uint64_t EndPrologueOffset,ContentTypeTracker *ContentTypes)

{
  uint *puVar1;
  uint64_t *Vals_1;
  byte bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  char *pcVar5;
  char acVar6 [8];
  ulong uVar7;
  Error *Err;
  long *plVar8;
  void *__dest;
  uint uVar9;
  ulong MinSize;
  bool bVar10;
  error_code EC;
  error_code EC_00;
  uint64_t EndPrologueOffset_local;
  Error local_90;
  uint64_t local_88;
  uint64_t *local_80;
  ContentTypeTracker *local_78;
  undefined1 local_70 [8];
  ContentDescriptors Descriptors;
  
  local_70 = (undefined1  [8])
             &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
              super_SmallVectorBase.Size;
  Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
  super_SmallVectorBase.BeginX = (void *)0x400000000;
  local_88 = EndPrologueOffset;
  bVar2 = llvm::DataExtractor::getU8(&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  uVar9 = (uint)bVar2;
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[0] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[1] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[2] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[3] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[4] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[5] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[6] = '\0';
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer[7] = '\0';
  local_80 = OffsetPtr;
  local_78 = ContentTypes;
  while (Vals_1 = local_80, bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
    if (local_88 <= *local_80) {
      pcVar5 = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = &EndPrologueOffset_local;
      llvm::createStringError<unsigned_long,unsigned_long>
                (EC,pcVar5,
                 (unsigned_long *)
                 "failed to parse entry content descriptions at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                 ,Vals_1);
      Err = (Error *)&EndPrologueOffset_local;
      goto LAB_00b35782;
    }
    uVar3 = llvm::DataExtractor::getULEB128
                      (&DebugLineData->super_DataExtractor,local_80,(Error *)0x0);
    uVar4 = llvm::DataExtractor::getULEB128(&DebugLineData->super_DataExtractor,Vals_1,(Error *)0x0)
    ;
    if (local_78 != (ContentTypeTracker *)0x0) {
      llvm::DWARFDebugLine::ContentTypeTracker::trackContentType
                (local_78,(LineNumberEntryFormat)uVar3);
    }
    if (Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
        super_SmallVectorBase.BeginX._4_4_ <=
        (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
              super_SmallVectorBase.BeginX) {
      llvm::SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>::grow
                ((SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true> *)local_70
                 ,0);
    }
    acVar6._1_7_ = Descriptors.
                   super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts
                   [3].buffer._1_7_;
    acVar6[0] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                InlineElts[3].buffer[0] | (LineNumberEntryFormat)uVar3 == DW_LNCT_path;
    *(uint64_t *)
     ((long)local_70 +
     (ulong)(uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                  super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                  super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                  super_SmallVectorBase.BeginX * 8) = uVar3 & 0xffffffff | (uVar4 & 0xffff) << 0x20;
    Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3]
    .buffer = acVar6;
    llvm::SmallVectorBase::set_size
              ((SmallVectorBase *)local_70,
               ((ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                       super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                       .
                       super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                       .super_SmallVectorBase.BeginX & 0xffffffff) + 1);
  }
  if (((ulong)Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer & 1) == 0) {
    pcVar5 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x16;
    EC_00._0_8_ = &local_90;
    llvm::createStringError(EC_00,pcVar5);
    Err = &local_90;
LAB_00b35782:
    llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::Expected
              (__return_storage_ptr__,Err);
    plVar8 = (long *)((ulong)Err->Payload & 0xfffffffffffffffe);
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 8))();
    }
    goto LAB_00b357ed;
  }
  __return_storage_ptr__->field_0x30 = __return_storage_ptr__->field_0x30 & 0xfe;
  llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::getStorage
            (__return_storage_ptr__);
  __dest = (void *)((long)&__return_storage_ptr__->field_0 + 0x10);
  *(void **)&__return_storage_ptr__->field_0 = __dest;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0x400000000;
  MinSize = (ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                   super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                   super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                   super_SmallVectorBase.BeginX & 0xffffffff;
  if ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)local_70 ==
      __return_storage_ptr__ || MinSize == 0) goto LAB_00b357ed;
  puVar1 = &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
            super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
            super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
            super_SmallVectorBase.Size;
  if (local_70 == (undefined1  [8])puVar1) {
    uVar7 = MinSize;
    if ((uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
              super_SmallVectorBase.BeginX < 5) {
LAB_00b357d4:
      memcpy(__dest,(void *)local_70,uVar7 << 3);
    }
    else {
      llvm::SmallVectorBase::set_size((SmallVectorBase *)__return_storage_ptr__,0);
      llvm::SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>::grow
                ((SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true> *)
                 __return_storage_ptr__,MinSize);
      uVar7 = (ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                     super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                     .super_SmallVectorBase.BeginX & 0xffffffff;
      if (uVar7 != 0) {
        __dest = *(void **)(__return_storage_ptr__->field_0).ErrorStorage.buffer;
        goto LAB_00b357d4;
      }
    }
    llvm::SmallVectorBase::set_size((SmallVectorBase *)__return_storage_ptr__,MinSize);
  }
  else {
    *(undefined1 (*) [8])&__return_storage_ptr__->field_0 = local_70;
    *(uint *)((long)&__return_storage_ptr__->field_0 + 8) =
         (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
               super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
               super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
               super_SmallVectorBase.BeginX;
    *(uint *)((long)&__return_storage_ptr__->field_0 + 0xc) =
         Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
         super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
         super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
         super_SmallVectorBase.BeginX._4_4_;
    Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
    super_SmallVectorBase.BeginX = (void *)0x0;
    local_70 = (undefined1  [8])puVar1;
  }
  Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
  super_SmallVectorBase.BeginX =
       (void *)((ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                       super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                       .
                       super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                       .super_SmallVectorBase.BeginX & 0xffffffff00000000);
LAB_00b357ed:
  llvm::SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>::~SmallVectorImpl
            ((SmallVectorImpl<(anonymous_namespace)::ContentDescriptor> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

static llvm::Expected<ContentDescriptors>
parseV5EntryFormat(const DWARFDataExtractor &DebugLineData, uint64_t *OffsetPtr,
                   uint64_t EndPrologueOffset,
                   DWARFDebugLine::ContentTypeTracker *ContentTypes) {
  ContentDescriptors Descriptors;
  int FormatCount = DebugLineData.getU8(OffsetPtr);
  bool HasPath = false;
  for (int I = 0; I != FormatCount; ++I) {
    if (*OffsetPtr >= EndPrologueOffset)
      return createStringError(
          errc::invalid_argument,
          "failed to parse entry content descriptions at offset "
          "0x%8.8" PRIx64
          " because offset extends beyond the prologue end at offset "
          "0x%8.8" PRIx64,
          *OffsetPtr, EndPrologueOffset);
    ContentDescriptor Descriptor;
    Descriptor.Type =
      dwarf::LineNumberEntryFormat(DebugLineData.getULEB128(OffsetPtr));
    Descriptor.Form = dwarf::Form(DebugLineData.getULEB128(OffsetPtr));
    if (Descriptor.Type == dwarf::DW_LNCT_path)
      HasPath = true;
    if (ContentTypes)
      ContentTypes->trackContentType(Descriptor.Type);
    Descriptors.push_back(Descriptor);
  }

  if (!HasPath)
    return createStringError(errc::invalid_argument,
                             "failed to parse entry content descriptions"
                             " because no path was found");
  return Descriptors;
}